

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_convolutiondepthwise_activation(NetOptimize *this)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  FILE *__stream;
  value_type pLVar4;
  bool bVar5;
  reference ppLVar6;
  reference pvVar7;
  size_type sVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  void **ppvVar11;
  Mat *pMVar12;
  reference pvVar13;
  long in_RDI;
  int top_blob_index_final;
  HardSwish *hardswish;
  Clip *clip;
  ReLU *relu;
  Layer *activation;
  ConvolutionDepthWise *convolutiondepthwise;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  char *in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc14;
  Allocator *in_stack_fffffffffffffc18;
  Mat *in_stack_fffffffffffffc20;
  Mat *in_stack_fffffffffffffc28;
  Mat *in_stack_fffffffffffffc30;
  Mat local_350;
  value_type local_308;
  void *local_300;
  int *local_2f8;
  undefined8 local_2f0;
  undefined4 local_2e8;
  long *local_2e0;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined8 local_2c0;
  value_type local_2b8;
  void *local_2a0;
  int *local_298;
  undefined8 local_290;
  undefined4 local_288;
  long *local_280;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 local_26c;
  undefined4 local_268;
  undefined8 local_260;
  value_type local_258;
  value_type local_250;
  value_type local_248;
  size_type local_240;
  value_type local_234;
  size_type local_230;
  ulong local_228;
  void **local_218;
  void **local_208;
  Mat *local_1f8;
  int local_1e8;
  undefined4 local_1e4;
  Mat *local_1e0;
  Mat *local_1d8;
  Mat *local_1d0;
  int local_1c8;
  undefined4 local_1c4;
  void **local_1c0;
  void **local_1b8;
  void **local_1b0;
  int local_1a8;
  undefined4 local_1a4;
  void **local_1a0;
  void **local_198;
  void **local_190;
  undefined8 local_188;
  long *local_180;
  undefined8 local_178;
  undefined8 *local_170;
  undefined8 local_168;
  long *local_160;
  undefined8 local_158;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined4 local_124;
  void **local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined4 local_104;
  void **local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined4 local_e4;
  Mat *local_e0;
  int local_d8;
  undefined4 local_d4;
  void **local_d0;
  int local_c8;
  undefined4 local_c4;
  void **local_c0;
  int local_b8;
  undefined4 local_b4;
  Mat *local_b0;
  int local_98;
  undefined4 local_94;
  Mat *local_90;
  int local_78;
  undefined4 local_74;
  void **local_70;
  int local_58;
  undefined4 local_54;
  void **local_50;
  void *local_48;
  void *local_38;
  void *local_28;
  void *local_18;
  void *local_10;
  void *local_8;
  
  local_228 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58))
  ;
  local_230 = 0;
  do {
    if (local_228 <= local_230) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_230)
    ;
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                            in_stack_fffffffffffffc08);
    if (!bVar5) {
      ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_230);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->tops,0);
      local_234 = *pvVar7;
      local_240 = local_230;
LAB_00180602:
      do {
        do {
          local_240 = local_240 + 1;
          if (local_228 <= local_240) goto LAB_00180798;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_240);
          bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                                  in_stack_fffffffffffffc08);
          if (bVar5) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_240);
            bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)
                                    ,in_stack_fffffffffffffc08);
            if (bVar5) {
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                         local_240);
              bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffc14,
                                                  in_stack_fffffffffffffc10),
                                      in_stack_fffffffffffffc08);
              if (bVar5) {
                std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_240);
                bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffffc14,
                                                    in_stack_fffffffffffffc10),
                                        in_stack_fffffffffffffc08);
                if (bVar5) {
                  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_240);
                  bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT44(in_stack_fffffffffffffc14,
                                                      in_stack_fffffffffffffc10),
                                          in_stack_fffffffffffffc08);
                  if (bVar5) goto LAB_00180602;
                }
              }
            }
          }
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_240);
          sVar8 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar6)->bottoms);
        } while (sVar8 != 1);
        ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_240);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->bottoms,0);
      } while (*pvVar7 != local_234);
LAB_00180798:
      if (local_240 != local_228) {
        ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_230);
        local_248 = *ppLVar6;
        ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_240);
        __stream = _stderr;
        local_250 = *ppLVar6;
        uVar9 = std::__cxx11::string::c_str();
        uVar10 = std::__cxx11::string::c_str();
        fprintf(__stream,"fuse_convolutiondepthwise_activation %s %s\n",uVar9,uVar10);
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                                in_stack_fffffffffffffc08);
        if (bVar5) {
          local_258 = local_250;
          if ((*(float *)&local_250[1]._vptr_Layer != 0.0) ||
             (NAN(*(float *)&local_250[1]._vptr_Layer))) {
            *(undefined4 *)&local_248[1].type.field_2 = 2;
            local_120 = &local_2a0;
            local_124 = 1;
            local_130 = 4;
            local_138 = 0;
            local_2a0 = (void *)0x0;
            local_298 = (int *)0x0;
            local_290 = 0;
            local_288 = 0;
            local_280 = (long *)0x0;
            local_278 = 0;
            local_274 = 0;
            local_270 = 0;
            local_26c = 0;
            local_268 = 0;
            local_260 = 0;
            ncnn::Mat::create(in_stack_fffffffffffffc30,
                              (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                              (size_t)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
            pLVar4 = local_248;
            ppvVar11 = (void **)((long)&local_248[1].type.field_2 + 8);
            local_1a0 = &local_2a0;
            local_198 = ppvVar11;
            if (ppvVar11 != local_1a0) {
              if (local_298 != (int *)0x0) {
                local_1a4 = 1;
                LOCK();
                local_1a8 = *local_298;
                *local_298 = *local_298 + 1;
                UNLOCK();
              }
              local_d0 = ppvVar11;
              if (*(long *)&local_248[1].name != 0) {
                piVar2 = *(int **)&local_248[1].name;
                local_d4 = 0xffffffff;
                LOCK();
                local_d8 = *piVar2;
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (local_d8 == 1) {
                  if (*(long *)((long)&local_248[1].name.field_2 + 8) == 0) {
                    local_8 = *ppvVar11;
                    if (local_8 != (void *)0x0) {
                      free(local_8);
                    }
                  }
                  else {
                    plVar3 = *(long **)((long)&local_248[1].name.field_2 + 8);
                    (**(code **)(*plVar3 + 0x18))(plVar3,*ppvVar11);
                  }
                }
              }
              *ppvVar11 = (void *)0x0;
              pLVar4[1].name._M_string_length = 0;
              *(undefined4 *)&pLVar4[1].name.field_2 = 0;
              *(undefined4 *)
               &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = 0;
              *(undefined4 *)
               ((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) = 0;
              *(undefined4 *)
               &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = 0;
              *(undefined4 *)
               ((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4) = 0;
              *(undefined4 *)
               &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = 0;
              pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              *(undefined8 *)&pLVar4[1].name = 0;
              *ppvVar11 = *local_1a0;
              *(void **)&pLVar4[1].name = local_1a0[1];
              pLVar4[1].name._M_string_length = (size_type)local_1a0[2];
              *(undefined4 *)&pLVar4[1].name.field_2 = *(undefined4 *)(local_1a0 + 3);
              *(void **)((long)&pLVar4[1].name.field_2 + 8) = local_1a0[4];
              *(undefined4 *)
               &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = *(undefined4 *)(local_1a0 + 5);
              *(undefined4 *)
               ((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) =
                   *(undefined4 *)((long)local_1a0 + 0x2c);
              *(undefined4 *)
               &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = *(undefined4 *)(local_1a0 + 6);
              *(undefined4 *)
               ((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4) =
                   *(undefined4 *)((long)local_1a0 + 0x34);
              *(undefined4 *)
               &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = *(undefined4 *)(local_1a0 + 7);
              pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_1a0[8];
            }
            local_218 = &local_2a0;
            local_190 = ppvVar11;
            local_50 = local_218;
            if (local_298 != (int *)0x0) {
              local_54 = 0xffffffff;
              LOCK();
              local_58 = *local_298;
              *local_298 = *local_298 + -1;
              UNLOCK();
              if (local_58 == 1) {
                if (local_280 == (long *)0x0) {
                  local_48 = local_2a0;
                  if (local_2a0 != (void *)0x0) {
                    free(local_2a0);
                  }
                }
                else {
                  (**(code **)(*local_280 + 0x18))(local_280,local_2a0);
                }
              }
            }
            local_2a0 = (void *)0x0;
            local_290 = 0;
            local_288 = 0;
            local_278 = 0;
            local_274 = 0;
            local_270 = 0;
            local_26c = 0;
            local_268 = 0;
            local_260 = 0;
            local_298 = (int *)0x0;
            local_140 = (undefined8 *)((long)&local_248[1].type.field_2 + 8);
            local_148 = 0;
            *(undefined4 *)*local_140 = *(undefined4 *)&local_258[1]._vptr_Layer;
          }
          else {
            *(undefined4 *)&local_248[1].type.field_2 = 1;
          }
        }
        else {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                                  in_stack_fffffffffffffc08);
          if (bVar5) {
            local_2b8 = local_250;
            *(undefined4 *)&local_248[1].type.field_2 = 3;
            local_100 = &local_300;
            local_104 = 2;
            local_110 = 4;
            local_118 = 0;
            local_300 = (void *)0x0;
            local_2f8 = (int *)0x0;
            local_2f0 = 0;
            local_2e8 = 0;
            local_2e0 = (long *)0x0;
            local_2d8 = 0;
            local_2d4 = 0;
            local_2d0 = 0;
            local_2cc = 0;
            local_2c8 = 0;
            local_2c0 = 0;
            ncnn::Mat::create(in_stack_fffffffffffffc30,
                              (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                              (size_t)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
            pLVar4 = local_248;
            ppvVar11 = (void **)((long)&local_248[1].type.field_2 + 8);
            local_1c0 = &local_300;
            local_1b8 = ppvVar11;
            if (ppvVar11 != local_1c0) {
              if (local_2f8 != (int *)0x0) {
                local_1c4 = 1;
                LOCK();
                local_1c8 = *local_2f8;
                *local_2f8 = *local_2f8 + 1;
                UNLOCK();
              }
              local_c0 = ppvVar11;
              if (*(long *)&local_248[1].name != 0) {
                piVar2 = *(int **)&local_248[1].name;
                local_c4 = 0xffffffff;
                LOCK();
                local_c8 = *piVar2;
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (local_c8 == 1) {
                  if (*(long *)((long)&local_248[1].name.field_2 + 8) == 0) {
                    local_10 = *ppvVar11;
                    if (local_10 != (void *)0x0) {
                      free(local_10);
                    }
                  }
                  else {
                    plVar3 = *(long **)((long)&local_248[1].name.field_2 + 8);
                    (**(code **)(*plVar3 + 0x18))(plVar3,*ppvVar11);
                  }
                }
              }
              *ppvVar11 = (void *)0x0;
              pLVar4[1].name._M_string_length = 0;
              *(undefined4 *)&pLVar4[1].name.field_2 = 0;
              *(undefined4 *)
               &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = 0;
              *(undefined4 *)
               ((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) = 0;
              *(undefined4 *)
               &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = 0;
              *(undefined4 *)
               ((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4) = 0;
              *(undefined4 *)
               &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = 0;
              pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              *(undefined8 *)&pLVar4[1].name = 0;
              *ppvVar11 = *local_1c0;
              *(void **)&pLVar4[1].name = local_1c0[1];
              pLVar4[1].name._M_string_length = (size_type)local_1c0[2];
              *(undefined4 *)&pLVar4[1].name.field_2 = *(undefined4 *)(local_1c0 + 3);
              *(void **)((long)&pLVar4[1].name.field_2 + 8) = local_1c0[4];
              *(undefined4 *)
               &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = *(undefined4 *)(local_1c0 + 5);
              *(undefined4 *)
               ((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) =
                   *(undefined4 *)((long)local_1c0 + 0x2c);
              *(undefined4 *)
               &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = *(undefined4 *)(local_1c0 + 6);
              *(undefined4 *)
               ((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4) =
                   *(undefined4 *)((long)local_1c0 + 0x34);
              *(undefined4 *)
               &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = *(undefined4 *)(local_1c0 + 7);
              pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_1c0[8];
            }
            local_208 = &local_300;
            local_1b0 = ppvVar11;
            local_70 = local_208;
            if (local_2f8 != (int *)0x0) {
              local_74 = 0xffffffff;
              LOCK();
              local_78 = *local_2f8;
              *local_2f8 = *local_2f8 + -1;
              UNLOCK();
              if (local_78 == 1) {
                if (local_2e0 == (long *)0x0) {
                  local_38 = local_300;
                  if (local_300 != (void *)0x0) {
                    free(local_300);
                  }
                }
                else {
                  (**(code **)(*local_2e0 + 0x18))(local_2e0,local_300);
                }
              }
            }
            local_300 = (void *)0x0;
            local_2f0 = 0;
            local_2e8 = 0;
            local_2d8 = 0;
            local_2d4 = 0;
            local_2d0 = 0;
            local_2cc = 0;
            local_2c8 = 0;
            local_2c0 = 0;
            local_2f8 = (int *)0x0;
            local_150 = (undefined8 *)((long)&local_248[1].type.field_2 + 8);
            local_158 = 0;
            *(undefined4 *)*local_150 = *(undefined4 *)&local_2b8[1]._vptr_Layer;
            local_160 = (long *)((long)&local_248[1].type.field_2 + 8);
            local_168 = 1;
            *(undefined4 *)(*local_160 + 4) = *(undefined4 *)((long)&local_2b8[1]._vptr_Layer + 4);
          }
          else {
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)
                                    ,in_stack_fffffffffffffc08);
            if (bVar5) {
              *(undefined4 *)&local_248[1].type.field_2 = 4;
            }
            else {
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffc14,
                                                  in_stack_fffffffffffffc10),
                                      in_stack_fffffffffffffc08);
              if (bVar5) {
                *(undefined4 *)&local_248[1].type.field_2 = 5;
              }
              else {
                bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffffc14,
                                                    in_stack_fffffffffffffc10),
                                        in_stack_fffffffffffffc08);
                if (bVar5) {
                  local_308 = local_250;
                  *(undefined4 *)&local_248[1].type.field_2 = 6;
                  in_stack_fffffffffffffc30 = &local_350;
                  local_e4 = 2;
                  local_f0 = 4;
                  local_f8 = 0;
                  local_350.data = (void *)0x0;
                  local_350.refcount = (int *)0x0;
                  local_350.elemsize = 0;
                  local_350.elempack = 0;
                  local_350.allocator = (Allocator *)0x0;
                  local_350.dims = 0;
                  local_350.w = 0;
                  local_350.h = 0;
                  local_350.d = 0;
                  local_350.c = 0;
                  local_350.cstep = 0;
                  local_e0 = in_stack_fffffffffffffc30;
                  ncnn::Mat::create(in_stack_fffffffffffffc30,
                                    (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                                    (size_t)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
                  pLVar4 = local_248;
                  pMVar12 = (Mat *)(local_248[1].type.field_2._M_local_buf + 8);
                  local_1e0 = &local_350;
                  local_1d8 = pMVar12;
                  if (pMVar12 != local_1e0) {
                    if (local_350.refcount != (int *)0x0) {
                      local_1e4 = 1;
                      LOCK();
                      local_1e8 = *local_350.refcount;
                      *local_350.refcount = *local_350.refcount + 1;
                      UNLOCK();
                    }
                    in_stack_fffffffffffffc28 = pMVar12;
                    local_b0 = pMVar12;
                    if (*(long *)&local_248[1].name != 0) {
                      piVar2 = *(int **)&local_248[1].name;
                      local_b4 = 0xffffffff;
                      LOCK();
                      local_b8 = *piVar2;
                      *piVar2 = *piVar2 + -1;
                      UNLOCK();
                      if (local_b8 == 1) {
                        if (*(long *)((long)&local_248[1].name.field_2 + 8) == 0) {
                          local_18 = pMVar12->data;
                          if (local_18 != (void *)0x0) {
                            free(local_18);
                          }
                        }
                        else {
                          plVar3 = *(long **)((long)&local_248[1].name.field_2 + 8);
                          (**(code **)(*plVar3 + 0x18))(plVar3,pMVar12->data);
                        }
                      }
                    }
                    in_stack_fffffffffffffc28->data = (void *)0x0;
                    in_stack_fffffffffffffc28->elemsize = 0;
                    in_stack_fffffffffffffc28->elempack = 0;
                    in_stack_fffffffffffffc28->dims = 0;
                    in_stack_fffffffffffffc28->w = 0;
                    in_stack_fffffffffffffc28->h = 0;
                    in_stack_fffffffffffffc28->d = 0;
                    in_stack_fffffffffffffc28->c = 0;
                    in_stack_fffffffffffffc28->cstep = 0;
                    in_stack_fffffffffffffc28->refcount = (int *)0x0;
                    pMVar12->data = local_1e0->data;
                    *(int **)&pLVar4[1].name = local_1e0->refcount;
                    pLVar4[1].name._M_string_length = local_1e0->elemsize;
                    *(int *)&pLVar4[1].name.field_2 = local_1e0->elempack;
                    *(Allocator **)((long)&pLVar4[1].name.field_2 + 8) = local_1e0->allocator;
                    *(int *)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start = local_1e0->dims;
                    *(int *)((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 4) = local_1e0->w;
                    *(int *)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_finish = local_1e0->h;
                    *(int *)((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 4) = local_1e0->d;
                    *(int *)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage = local_1e0->c;
                    pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)local_1e0->cstep;
                  }
                  in_stack_fffffffffffffc20 = &local_350;
                  local_1f8 = in_stack_fffffffffffffc20;
                  local_1d0 = pMVar12;
                  local_90 = in_stack_fffffffffffffc20;
                  if (local_350.refcount != (int *)0x0) {
                    local_94 = 0xffffffff;
                    LOCK();
                    local_98 = *local_350.refcount;
                    *local_350.refcount = *local_350.refcount + -1;
                    UNLOCK();
                    if (local_98 == 1) {
                      if (local_350.allocator == (Allocator *)0x0) {
                        local_28 = local_350.data;
                        if (local_350.data != (void *)0x0) {
                          free(local_350.data);
                        }
                      }
                      else {
                        (*(local_350.allocator)->_vptr_Allocator[3])
                                  (local_350.allocator,local_350.data);
                      }
                    }
                  }
                  in_stack_fffffffffffffc20->data = (void *)0x0;
                  in_stack_fffffffffffffc20->elemsize = 0;
                  in_stack_fffffffffffffc20->elempack = 0;
                  in_stack_fffffffffffffc20->dims = 0;
                  in_stack_fffffffffffffc20->w = 0;
                  in_stack_fffffffffffffc20->h = 0;
                  in_stack_fffffffffffffc20->d = 0;
                  in_stack_fffffffffffffc20->c = 0;
                  in_stack_fffffffffffffc20->cstep = 0;
                  in_stack_fffffffffffffc20->refcount = (int *)0x0;
                  local_170 = (undefined8 *)((long)&local_248[1].type.field_2 + 8);
                  local_178 = 0;
                  *(undefined4 *)*local_170 = *(undefined4 *)&local_308[1]._vptr_Layer;
                  local_180 = (long *)((long)&local_248[1].type.field_2 + 8);
                  local_188 = 1;
                  *(undefined4 *)(*local_180 + 4) =
                       *(undefined4 *)((long)&local_308[1]._vptr_Layer + 4);
                }
              }
            }
          }
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_250->tops,0);
        iVar1 = *pvVar7;
        in_stack_fffffffffffffc10 = iVar1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_248->tops,0);
        *pvVar7 = in_stack_fffffffffffffc10;
        in_stack_fffffffffffffc14 = (int)local_230;
        pvVar13 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                             (long)iVar1);
        pvVar13->producer = in_stack_fffffffffffffc14;
        std::__cxx11::string::operator=((string *)&local_250->type,"ncnnfused");
      }
    }
    local_230 = local_230 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_activation()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - Activation
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid" && layers[j]->type != "Mish" && layers[j]->type != "HardSwish")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - Activation to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_convolutiondepthwise_activation %s %s\n", convolutiondepthwise->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                convolutiondepthwise->activation_type = 1;
            }
            else
            {
                convolutiondepthwise->activation_type = 2;
                convolutiondepthwise->activation_params = ncnn::Mat(1);
                convolutiondepthwise->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            convolutiondepthwise->activation_type = 3;
            convolutiondepthwise->activation_params = ncnn::Mat(2);
            convolutiondepthwise->activation_params[0] = clip->min;
            convolutiondepthwise->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            convolutiondepthwise->activation_type = 4;
        }
        else if (activation->type == "Mish")
        {
            convolutiondepthwise->activation_type = 5;
        }
        else if (activation->type == "HardSwish")
        {
            ncnn::HardSwish* hardswish = (ncnn::HardSwish*)activation;

            convolutiondepthwise->activation_type = 6;
            convolutiondepthwise->activation_params = ncnn::Mat(2);
            convolutiondepthwise->activation_params[0] = hardswish->alpha;
            convolutiondepthwise->activation_params[1] = hardswish->beta;
        }

        int top_blob_index_final = activation->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}